

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<char,unsigned_short>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  unsigned_short uVar2;
  int iVar3;
  unsigned_short u;
  int local_38;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_33;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  
  u = 0;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_short>
            (&local_33,&u);
  su.m_int = u;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_short>
            (&st2,&su);
  local_33.m_int = '\0';
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,&u);
  if (su.m_int < 0x80) {
    local_33.m_int = st2.m_int;
    SafeInt::operator_cast_to_unsigned_short((SafeInt *)&local_33);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*(&local_33,st2);
    operator*(u,local_33);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,su);
    u = 1;
    iVar3 = 1;
    local_38 = iVar3;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,
               &local_38);
    local_38 = iVar3;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
               &local_38);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    local_38 = iVar3;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,&local_38)
    ;
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%(&local_33,st2);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,su);
    u = 1;
    local_38 = iVar3;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,&local_38)
    ;
    local_38 = iVar3;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,
               &local_38);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/(&local_33,st2);
    operator/(u,local_33);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,su);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+(&local_33,st2);
    operator+(u,local_33);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,su);
    local_38 = 0;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,
               &local_38);
    u = 0;
    local_38 = 0;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,&local_38)
    ;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-(&local_33,st2);
    operator-(u,local_33);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    local_38 = iVar3;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,
               &local_38);
    local_38 = iVar3;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
               &local_38);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,su);
    u = 1;
    local_38 = iVar3;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
               &local_38);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SVar1 = SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_33,su);
    operator<<(SVar1.m_int,su);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,su);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SVar1 = SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_33,su);
    operator>>(SVar1.m_int,su);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,u);
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_33,su);
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_33,st2);
    uVar2 = BinaryAndHelper<unsigned_short,_char,_1>::And(su.m_int,local_33.m_int & (byte)u);
    local_38._0_2_ = uVar2;
    SafeInt::operator_cast_to_char((SafeInt *)&local_38);
    local_33.m_int = (byte)su.m_int & (byte)u & local_33.m_int & st2.m_int;
    local_38._0_2_ = BinaryOrHelper<unsigned_short,_char,_1>::Or(su.m_int,(byte)u);
    SafeInt::operator_cast_to_char((SafeInt *)&local_38);
    local_33.m_int = (byte)su.m_int | (byte)u | local_33.m_int | st2.m_int;
    uVar2 = BinaryXorHelper<unsigned_short,_char,_1>::Xor(su.m_int,local_33.m_int ^ (byte)u);
    local_38 = CONCAT22(local_38._2_2_,uVar2);
    SafeInt::operator_cast_to_char((SafeInt *)&local_38);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}